

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WFXMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::WFXMLScanner::scanDocTypeDecl(WFXMLScanner *this)

{
  XMLCh XVar1;
  XMLCh nextCh;
  WFXMLScanner *this_local;
  
  XVar1 = ReaderMgr::skipUntilIn(&(this->super_XMLScanner).fReaderMgr,L"[>");
  if (XVar1 == L'[') {
    ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L']');
  }
  ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
  return;
}

Assistant:

void WFXMLScanner::scanDocTypeDecl()
{
    // Just skips over it
    // REVISIT: Should we issue a warning
    static const XMLCh doctypeIE[] =
    {
        chOpenSquare, chCloseAngle, chNull
    };
    XMLCh nextCh = fReaderMgr.skipUntilIn(doctypeIE);

    if (nextCh == chOpenSquare)
        fReaderMgr.skipPastChar(chCloseSquare);

    fReaderMgr.skipPastChar(chCloseAngle);
}